

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O3

boolean pmatch(char *patrn,char *strng)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  
  do {
    do {
      cVar1 = *patrn;
      patrn = patrn + 1;
      while (cVar2 = *strng, cVar1 == '*') {
        if (*patrn == '\0') {
          return '\x01';
        }
        bVar3 = pmatch(patrn,strng);
        if (bVar3 != '\0') {
          return '\x01';
        }
        strng = strng + 1;
        if (cVar2 == '\0') {
          return '\0';
        }
      }
      if (cVar1 == '\0') {
        return cVar2 == '\0';
      }
      strng = strng + 1;
    } while (cVar1 == cVar2);
    if (cVar1 != '?') {
      return '\0';
    }
  } while (cVar2 != '\0');
  return '\0';
}

Assistant:

boolean pmatch(const char *patrn, const char *strng)
{
    char s, p;
  /*
   :  Simple pattern matcher:  '*' matches 0 or more characters, '?' matches
   :  any single character.  Returns TRUE if 'strng' matches 'patrn'.
   */
pmatch_top:
    s = *strng++;  p = *patrn++;	/* get next chars and pre-advance */
    if (!p)			/* end of pattern */
	return (boolean)(s == '\0');		/* matches iff end of string too */
    else if (p == '*')		/* wildcard reached */
	return((boolean)((!*patrn || pmatch(patrn, strng-1)) ? TRUE :
		s ? pmatch(patrn-1, strng) : FALSE));
    else if (p != s && (p != '?' || !s))  /* check single character */
	return FALSE;		/* doesn't match */
    else				/* return pmatch(patrn, strng); */
	goto pmatch_top;	/* optimize tail recursion */
}